

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

size_t NodeId_calcSizeBinary(UA_NodeId *src,UA_DataType *_)

{
  size_t sVar1;
  
  sVar1 = 0;
  switch(src->identifierType) {
  case UA_NODEIDTYPE_NUMERIC:
    sVar1 = 7;
    if (((src->identifier).numeric < 0x10000) && (src->namespaceIndex < 0x100)) {
      sVar1 = 4;
      if ((src->identifier).numeric < 0x100) {
        sVar1 = (ulong)(src->namespaceIndex != 0) * 2 + 2;
      }
    }
    break;
  case UA_NODEIDTYPE_STRING:
  case UA_NODEIDTYPE_BYTESTRING:
    sVar1 = (src->identifier).string.length + 7;
    break;
  case UA_NODEIDTYPE_GUID:
    sVar1 = 0x13;
  }
  return sVar1;
}

Assistant:

static size_t
NodeId_calcSizeBinary(const UA_NodeId *UA_RESTRICT src, const UA_DataType *_) {
    size_t s = 1; // encoding byte
    switch (src->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        if(src->identifier.numeric > UA_UINT16_MAX || src->namespaceIndex > UA_BYTE_MAX) {
            s += 6;
        } else if(src->identifier.numeric > UA_BYTE_MAX || src->namespaceIndex > 0) {
            s += 3;
        } else {
            s += 1;
        }
        break;
    case UA_NODEIDTYPE_BYTESTRING:
    case UA_NODEIDTYPE_STRING:
        s += 2;
        s += String_calcSizeBinary(&src->identifier.string, NULL);
        break;
    case UA_NODEIDTYPE_GUID:
        s += 18;
        break;
    default:
        return 0;
    }
    return s;
}